

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall cimg_library::CImgDisplay::show(CImgDisplay *this)

{
  CImgDisplay *pCVar1;
  
  if (((this->_width != 0) && (this->_height != 0)) && (this->_is_closed == true)) {
    cimg::mutex(0xf,1);
    this->_is_closed = false;
    if (this->_is_fullscreen == true) {
      _init_fullscreen(this);
    }
    _map_window(this);
    cimg::mutex(0xf,0);
    pCVar1 = paint(this,true);
    return pCVar1;
  }
  return this;
}

Assistant:

CImgDisplay& show() {
      if (is_empty() || !_is_closed) return *this;
      cimg_lock_display();
      _is_closed = false;
      if (_is_fullscreen) _init_fullscreen();
      _map_window();
      cimg_unlock_display();
      return paint();
    }